

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O1

void __thiscall
llama_sbatch::from_batch
          (llama_sbatch *this,llama_batch *batch,size_t n_embd,bool simple_split,bool logits_all)

{
  vector<long,_std::allocator<long>_> *this_00;
  pointer *pplVar1;
  uint uVar2;
  pointer plVar3;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __first;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __last;
  llama_seq_id *plVar4;
  iterator __position;
  pointer plVar5;
  long lVar6;
  pointer plVar7;
  ulong uVar8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __i;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __last_00;
  size_type __new_size;
  size_t sVar9;
  __normal_iterator<llama_sbatch_seq_*,_std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>_>
  __i_1;
  pointer plVar10;
  bool bVar11;
  bool bVar12;
  llama_sbatch_seq new_seq;
  llama_sbatch_seq local_50;
  
  __new_size = (size_type)batch->n_tokens;
  if ((long)__new_size < 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
               ,0xc1,"GGML_ASSERT(%s) failed","batch.n_tokens >= 0");
  }
  this->batch = batch;
  this->n_embd = n_embd;
  this->logits_all = logits_all;
  this->n_tokens = __new_size;
  this_00 = &this->ids;
  std::vector<long,_std::allocator<long>_>::resize(this_00,__new_size);
  plVar3 = (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar3) {
    (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = plVar3;
  }
  if (this->n_tokens != 0) {
    plVar3 = (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      plVar3[uVar8] = uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->n_tokens);
  }
  if (simple_split) {
    std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::resize(&this->seq,1);
    plVar7 = (this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>.
             _M_impl.super__Vector_impl_data._M_start;
    plVar7->n_seq_id = 0;
    plVar7->seq_id = (llama_seq_id *)0x0;
    plVar7->offset = 0;
    plVar7->length = this->n_tokens;
  }
  else {
    __first._M_current =
         (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
         ._M_start;
    __last._M_current =
         (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    if (__first._M_current != __last._M_current) {
      uVar8 = (long)__last._M_current - (long)__first._M_current >> 3;
      lVar6 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<llama_sbatch::from_batch(llama_batch_const&,unsigned_long,bool,bool)::__0>>
                (__first,__last,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_batch_cpp:216:13)>
                  )batch);
      if ((long)__last._M_current - (long)__first._M_current < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_comp_iter<llama_sbatch::from_batch(llama_batch_const&,unsigned_long,bool,bool)::__0>>
                  (__first,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_batch_cpp:216:13)>
                    )batch);
      }
      else {
        __last_00._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_comp_iter<llama_sbatch::from_batch(llama_batch_const&,unsigned_long,bool,bool)::__0>>
                  (__first,__last_00,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_batch_cpp:216:13)>
                    )batch);
        for (; __last_00._M_current != __last._M_current;
            __last_00._M_current = __last_00._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Val_comp_iter<llama_sbatch::from_batch(llama_batch_const&,unsigned_long,bool,bool)::__0>>
                    (__last_00,
                     (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_batch_cpp:216:13)>
                      )batch);
        }
      }
    }
    if (this->n_tokens != 0) {
      plVar7 = (pointer)0x0;
      sVar9 = 0;
      do {
        lVar6 = (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start[sVar9];
        uVar2 = batch->n_seq_id[lVar6];
        plVar4 = batch->seq_id[lVar6];
        if (plVar7 == (pointer)0x0) {
LAB_001867f3:
          local_50.length = 1;
          __position._M_current =
               (this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_50.n_seq_id = uVar2;
          local_50.seq_id = plVar4;
          local_50.offset = sVar9;
          if (__position._M_current ==
              (this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<llama_sbatch_seq,std::allocator<llama_sbatch_seq>>::
            _M_realloc_insert<llama_sbatch_seq_const&>
                      ((vector<llama_sbatch_seq,std::allocator<llama_sbatch_seq>> *)&this->seq,
                       __position,&local_50);
          }
          else {
            (__position._M_current)->offset = sVar9;
            (__position._M_current)->length = 1;
            *(ulong *)__position._M_current = CONCAT44(local_50._4_4_,uVar2);
            (__position._M_current)->seq_id = plVar4;
            pplVar1 = &(this->seq).
                       super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *pplVar1 = *pplVar1 + 1;
          }
          plVar7 = (this->seq).
                   super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1;
        }
        else {
          bVar12 = uVar2 == plVar7->n_seq_id;
          if (0 < (int)uVar2 && bVar12) {
            bVar12 = uVar2 == plVar7->n_seq_id;
            uVar8 = 1;
            do {
              if (plVar4[uVar8 - 1] != plVar7->seq_id[uVar8 - 1]) {
                bVar12 = false;
              }
            } while ((bVar12) && (bVar11 = uVar8 < uVar2, uVar8 = uVar8 + 1, bVar11));
          }
          if (!bVar12) goto LAB_001867f3;
          plVar7->length = plVar7->length + 1;
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 < this->n_tokens);
    }
    plVar7 = (this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>.
             _M_impl.super__Vector_impl_data._M_start;
    plVar5 = (this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (plVar7 != plVar5) {
      uVar8 = (long)plVar5 - (long)plVar7 >> 5;
      lVar6 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<llama_sbatch_seq*,std::vector<llama_sbatch_seq,std::allocator<llama_sbatch_seq>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<llama_sbatch::from_batch(llama_batch_const&,unsigned_long,bool,bool)::__1>>
                (plVar7,plVar5,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)plVar5 - (long)plVar7 < 0x201) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<llama_sbatch_seq*,std::vector<llama_sbatch_seq,std::allocator<llama_sbatch_seq>>>,__gnu_cxx::__ops::_Iter_comp_iter<llama_sbatch::from_batch(llama_batch_const&,unsigned_long,bool,bool)::__1>>
                  (plVar7,plVar5);
      }
      else {
        plVar10 = plVar7 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<llama_sbatch_seq*,std::vector<llama_sbatch_seq,std::allocator<llama_sbatch_seq>>>,__gnu_cxx::__ops::_Iter_comp_iter<llama_sbatch::from_batch(llama_batch_const&,unsigned_long,bool,bool)::__1>>
                  (plVar7,plVar10);
        for (; plVar10 != plVar5; plVar10 = plVar10 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llama_sbatch_seq*,std::vector<llama_sbatch_seq,std::allocator<llama_sbatch_seq>>>,__gnu_cxx::__ops::_Val_comp_iter<llama_sbatch::from_batch(llama_batch_const&,unsigned_long,bool,bool)::__1>>
                    (plVar10);
        }
      }
    }
  }
  return;
}

Assistant:

void llama_sbatch::from_batch(const llama_batch & batch, size_t n_embd, bool simple_split, bool logits_all) {
    GGML_ASSERT(batch.n_tokens >= 0);
    this->batch = &batch;
    this->n_embd = n_embd;
    this->logits_all = logits_all;

    n_tokens = batch.n_tokens;
    ids.resize(n_tokens);
    out_ids.clear();
    // TODO: reserve out_ids and seq

    for (size_t i = 0; i < n_tokens; ++i) {
        ids[i] = i;
    }
    if (simple_split) {
        seq.resize(1);
        llama_sbatch_seq & s = seq[0];
        s.n_seq_id = 0;
        s.seq_id = nullptr;
        s.offset = 0;
        s.length = n_tokens;
        return;
    }
    std::sort(ids.begin(), ids.end(),
            [&batch](size_t a, size_t b) {
                int32_t n_seq_a = batch.n_seq_id ? batch.n_seq_id[a] : 1;
                int32_t n_seq_b = batch.n_seq_id ? batch.n_seq_id[b] : 1;
                // sort by seq_id, then by pos
                if (n_seq_a == n_seq_b) {
                    if (batch.seq_id) {
                        for (int32_t i = 0; i < n_seq_a; ++i) {
                            llama_seq_id seq_id_a = batch.seq_id[a][i];
                            llama_seq_id seq_id_b = batch.seq_id[b][i];
                            // smaller seq_ids go first
                            if (seq_id_a != seq_id_b) {
                                return seq_id_a < seq_id_b;
                            }
                        }
                    }
                    // when all else is equal, sort by pos
                    if (batch.pos) {
                        return batch.pos[a] < batch.pos[b];
                    }
                    // no pos, sort by id
                    return a < b;
                }
                // shared prompts go first
                return n_seq_a > n_seq_b;
            }
    );
    // init seq
    llama_sbatch_seq * last_seq = nullptr;

    for (size_t i = 0; i < n_tokens; ++i) {
        const size_t bi = ids[i];
        const int32_t n_seqs = batch.n_seq_id[bi];
        llama_seq_id * seq_ids = batch.seq_id[bi];
        if (last_seq != nullptr) {
            bool same = n_seqs == last_seq->n_seq_id;
            for (int32_t j = 0; same && j < n_seqs; ++j) {
                if (seq_ids[j] != last_seq->seq_id[j]) {
                    same = false;
                }
            }
            if (same) {
                last_seq->length += 1;
                continue;
            }
        }
        llama_sbatch_seq new_seq = {n_seqs, seq_ids, i, 1};
        seq.push_back(new_seq);
        last_seq = &seq.back();
    }
    // keep shared prompts first at the end, then sort by length descending.
    std::sort(seq.begin(), seq.end(),
            [](llama_sbatch_seq & a, llama_sbatch_seq & b) {
                if (a.n_seq_id == b.n_seq_id) {
                    return a.length > b.length;
                }
                return a.n_seq_id < b.n_seq_id;
            }
            );
}